

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSim.c
# Opt level: O0

Res_Sim_t * Res_SimAlloc(int nWords)

{
  Res_Sim_t *__s;
  Vec_Ptr_t *pVVar1;
  Vec_Vec_t *pVVar2;
  Res_Sim_t *p;
  int nWords_local;
  
  __s = (Res_Sim_t *)malloc(0x68);
  memset(__s,0,0x68);
  __s->nWords = nWords;
  __s->nPats = __s->nWords << 5;
  __s->nWordsIn = __s->nPats;
  __s->nBytesIn = __s->nPats << 2;
  __s->nPatsIn = __s->nPats << 5;
  __s->nWordsOut = __s->nPats * __s->nWords;
  __s->nPatsOut = __s->nPats * __s->nPats;
  pVVar1 = Vec_PtrAllocSimInfo(0x400,__s->nWordsIn);
  __s->vPats = pVVar1;
  pVVar1 = Vec_PtrAllocSimInfo(0x80,__s->nWords);
  __s->vPats0 = pVVar1;
  pVVar1 = Vec_PtrAllocSimInfo(0x80,__s->nWords);
  __s->vPats1 = pVVar1;
  pVVar1 = Vec_PtrAllocSimInfo(0x80,__s->nWordsOut);
  __s->vOuts = pVVar1;
  pVVar2 = Vec_VecStart(0x10);
  __s->vCands = pVVar2;
  return __s;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocate simulation engine.]

  Description []
               
  SideEffects []

  SeeAlso     []
 
***********************************************************************/
Res_Sim_t * Res_SimAlloc( int nWords )
{
    Res_Sim_t * p;
    p = ABC_ALLOC( Res_Sim_t, 1 );
    memset( p, 0, sizeof(Res_Sim_t) );
    // simulation parameters
    p->nWords    = nWords;
    p->nPats     = p->nWords * 8 * sizeof(unsigned);
    p->nWordsIn  = p->nPats;
    p->nBytesIn  = p->nPats * sizeof(unsigned);
    p->nPatsIn   = p->nPats * 8 * sizeof(unsigned);
    p->nWordsOut = p->nPats * p->nWords;
    p->nPatsOut  = p->nPats * p->nPats;
    // simulation info
    p->vPats     = Vec_PtrAllocSimInfo( 1024, p->nWordsIn );
    p->vPats0    = Vec_PtrAllocSimInfo( 128, p->nWords );
    p->vPats1    = Vec_PtrAllocSimInfo( 128, p->nWords );
    p->vOuts     = Vec_PtrAllocSimInfo( 128, p->nWordsOut );
    // resub candidates
    p->vCands    = Vec_VecStart( 16 );
    return p;
}